

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotateVector.h
# Opt level: O1

Vector3T<float> __thiscall
Gs::RotateVectorAroundAxis<float>(Gs *this,Vector3T<float> *vec,Vector3T<float> *axis,Real angle)

{
  size_t i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float result_2;
  float result_3;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector3T<float> VVar9;
  Vector3T<float> row2;
  Vector3T<float> row1;
  Vector3T<float> row0;
  float local_44 [6];
  Vector<float,_3UL> local_2c;
  
  Normalize<Gs::Vector<float,3ul>,float>(&local_2c,axis);
  axis->z = local_2c.z;
  axis->x = local_2c.x;
  axis->y = local_2c.y;
  fVar2 = sinf(angle);
  fVar3 = cosf(angle);
  fVar5 = 1.0 - fVar3;
  lVar1 = 0;
  fVar4 = axis->x;
  VVar9.z = axis->y;
  fVar6 = axis->z;
  fVar8 = fVar4 * VVar9.z * fVar5;
  local_2c.y = fVar8 - fVar2 * fVar6;
  local_2c.x = (1.0 - fVar4 * fVar4) * fVar3 + fVar4 * fVar4;
  fVar7 = fVar4 * fVar6 * fVar5;
  local_2c.z = fVar7 + fVar2 * VVar9.z;
  local_44[4] = (1.0 - VVar9.z * VVar9.z) * fVar3 + VVar9.z * VVar9.z;
  local_44[3] = fVar2 * fVar6 + fVar8;
  fVar5 = VVar9.z * fVar6 * fVar5;
  local_44[5] = fVar5 - fVar2 * fVar4;
  local_44[1] = fVar2 * fVar4 + fVar5;
  local_44[0] = fVar7 - fVar2 * VVar9.z;
  local_44[2] = (1.0 - fVar6 * fVar6) * fVar3 + fVar6 * fVar6;
  VVar9._0_8_ = 0;
  do {
    fVar4 = (float)VVar9._0_8_ + (&vec->x)[lVar1] * (&local_2c.x)[lVar1];
    VVar9._0_8_ = CONCAT44(0.0,fVar4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  VVar9.z = 0.0;
  lVar1 = 0;
  do {
    VVar9.z = VVar9.z + (&vec->x)[lVar1] * local_44[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar6 = 0.0;
  lVar1 = 0;
  do {
    fVar6 = fVar6 + (&vec->x)[lVar1] * local_44[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  *(float *)this = fVar4;
  *(float *)(this + 4) = VVar9.z;
  *(float *)(this + 8) = fVar6;
  return VVar9;
}

Assistant:

Vector3T<T> RotateVectorAroundAxis(const Vector3T<T>& vec, Vector3T<T> axis, Real angle)
{
    axis.Normalize();

    auto s       = std::sin(angle);
    auto c       = std::cos(angle);
    auto cInv    = Real(1) - c;

    Vector3T<T> row0, row1, row2;

    row0.x = axis.x*axis.x + c*(Real(1) - axis.x*axis.x);
    row0.y = axis.x*axis.y*cInv - s*axis.z;
    row0.z = axis.x*axis.z*cInv + s*axis.y;

    row1.x = axis.x*axis.y*cInv + s*axis.z;
    row1.y = axis.y*axis.y + c*(Real(1) - axis.y*axis.y);
    row1.z = axis.y*axis.z*cInv - s*axis.x;

    row2.x = axis.x*axis.z*cInv - s*axis.y;
    row2.y = axis.y*axis.z*cInv + s*axis.x;
    row2.z = axis.z*axis.z + c*(Real(1) - axis.z*axis.z);

    return Vector3T<T>(
        Dot(vec, row0),
        Dot(vec, row1),
        Dot(vec, row2)
    );
}